

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O1

size_t qHash(QCborValue *value,size_t seed)

{
  Type TVar1;
  QCborContainerPrivate *pQVar2;
  size_t sVar3;
  ulong uVar4;
  qsizetype objectSize;
  long in_FS_OFFSET;
  QStringView key;
  QByteArrayView key_00;
  Data local_58;
  QCborContainerPrivate *pQStack_50;
  undefined8 local_48;
  QUuid local_38;
  qsizetype local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  TVar1 = value->t;
  if (TVar1 < True) {
    if (TVar1 < Array) {
      if (TVar1 < ByteArray) {
        if (TVar1 != Invalid) {
          if (TVar1 == Integer) {
            uVar4 = seed ^ value->n;
            uVar4 = uVar4 >> 0x20 ^ uVar4;
          }
          else {
LAB_002e9749:
            uVar4 = 0x17;
            if ((TVar1 & 0xffffff00) == SimpleType) {
              uVar4 = (ulong)(uint)(TVar1 & 0xff);
            }
            uVar4 = seed >> 0x20 ^ seed ^ uVar4;
          }
          uVar4 = (uVar4 * -0x2917014799a6026d >> 0x20 ^ uVar4 * -0x2917014799a6026d) *
                  -0x2917014799a6026d;
          seed = uVar4 >> 0x20 ^ uVar4;
        }
      }
      else if (TVar1 == ByteArray) {
        local_58.d = (QDateTimePrivate *)0x0;
        pQStack_50 = (QCborContainerPrivate *)0x0;
        local_48 = 0;
        QCborValue::toByteArray
                  ((QByteArray *)&local_38,(QCborValue *)value,(QByteArray *)&local_58.data);
        key_00.m_data = (storage_type *)local_38.data4;
        key_00.m_size = local_28;
        seed = qHash(key_00,seed);
        if ((QArrayData *)local_38._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_38._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_38._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_38._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_38._0_8_,1,0x10);
          }
        }
        if (local_58.d != (QDateTimePrivate *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).super___atomic_base<int>
          ._M_i = (((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).
                  super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).
              super___atomic_base<int>._M_i == 0) {
            objectSize = 1;
LAB_002e9618:
            QArrayData::deallocate((QArrayData *)local_58.d,objectSize,0x10);
          }
        }
      }
      else {
        if (TVar1 != String) goto LAB_002e9749;
        local_58.d = (QDateTimePrivate *)0x0;
        pQStack_50 = (QCborContainerPrivate *)0x0;
        local_48 = 0;
        QCborValue::toString((QString *)&local_38,(QCborValue *)value,(QString *)&local_58.data);
        key.m_data = (storage_type_conflict *)local_38.data4;
        key.m_size = local_28;
        seed = qHash(key,seed);
        if ((QArrayData *)local_38._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_38._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_38._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_38._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_38._0_8_,2,0x10);
          }
        }
        if (local_58.d != (QDateTimePrivate *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).super___atomic_base<int>
          ._M_i = (((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).
                  super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_58.d)->super_QSharedData)->_q_value).
              super___atomic_base<int>._M_i == 0) {
            objectSize = 2;
            goto LAB_002e9618;
          }
        }
      }
    }
    else if (TVar1 < Tag) {
      if (TVar1 == Array) {
        QCborValue::toArray((QCborValue *)&local_38);
        seed = qHash((QCborArray *)&local_38,seed);
        QCborArray::~QCborArray((QCborArray *)&local_38);
      }
      else {
        if (TVar1 != Map) goto LAB_002e9749;
        QCborValue::toMap((QCborValue *)&local_38);
        seed = qHash((QCborMap *)&local_38,seed);
        QCborMap::~QCborMap((QCborMap *)&local_38);
      }
    }
    else if (TVar1 == Tag) {
      uVar4 = 0xffffffffffffffff;
      if (((TVar1 == Tag) && (pQVar2 = value->container, pQVar2 != (QCborContainerPrivate *)0x0)) &&
         ((pQVar2->elements).d.size == 2)) {
        uVar4 = (((pQVar2->elements).d.ptr)->field_0).value;
      }
      local_58.d = (QDateTimePrivate *)0x0;
      pQStack_50 = (QCborContainerPrivate *)0x0;
      local_48 = CONCAT44(local_48._4_4_,0x117);
      QCborValue::taggedValue
                ((QCborValue *)&local_38,(QCborValue *)value,(QCborValue *)&local_58.data);
      sVar3 = qHash((QCborValue *)&local_38,0);
      uVar4 = (uVar4 >> 0x20 ^ uVar4) * -0x2917014799a6026d;
      uVar4 = (uVar4 >> 0x20 ^ uVar4) * -0x2917014799a6026d;
      uVar4 = (seed >> 2) + seed * 0x40 + 0x9e3779b9 + (uVar4 >> 0x20 ^ uVar4) ^ seed;
      if (local_38.data4 != (uchar  [8])0x0) {
        QCborContainerPrivate::deref((QCborContainerPrivate *)local_38.data4);
      }
      if (pQStack_50 != (QCborContainerPrivate *)0x0) {
        QCborContainerPrivate::deref(pQStack_50);
      }
      seed = uVar4 * 0x40 + 0x9e3779b9 + (uVar4 >> 2) + sVar3 ^ uVar4;
    }
    else if (TVar1 != False) goto LAB_002e9749;
  }
  else if (TVar1 < DateTime) {
    if (1 < (uint)(TVar1 + ~True)) {
      if (TVar1 != True) {
        if (TVar1 == Double) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
            sVar3 = qHash((double)value->n,seed);
            return sVar3;
          }
          goto LAB_002e98a3;
        }
        goto LAB_002e9749;
      }
      seed = seed ^ 0x4179b061e0c0e0d0;
    }
  }
  else if (TVar1 < RegularExpression) {
    if (TVar1 == DateTime) {
      QDateTime::QDateTime((QDateTime *)&local_58.data);
      QCborValue::toDateTime((QCborValue *)&local_38,(QDateTime *)value);
      seed = qHash((QDateTime *)&local_38,seed);
      QDateTime::~QDateTime((QDateTime *)&local_38);
      QDateTime::~QDateTime((QDateTime *)&local_58.data);
    }
    else {
      if (TVar1 != Url) goto LAB_002e9749;
      QUrl::QUrl((QUrl *)&local_58.data);
      QCborValue::toUrl((QCborValue *)&local_38,(QUrl *)value);
      seed = qHash((QUrl *)&local_38,seed);
      QUrl::~QUrl((QUrl *)&local_38);
      QUrl::~QUrl((QUrl *)&local_58.data);
    }
  }
  else if (TVar1 == RegularExpression) {
    QRegularExpression::QRegularExpression((QRegularExpression *)&local_58.data);
    QCborValue::toRegularExpression((QCborValue *)&local_38,(QRegularExpression *)value);
    seed = qHash((QRegularExpression *)&local_38,seed);
    QRegularExpression::~QRegularExpression((QRegularExpression *)&local_38);
    QRegularExpression::~QRegularExpression((QRegularExpression *)&local_58.data);
  }
  else {
    if (TVar1 != Uuid) goto LAB_002e9749;
    local_58.d = (QDateTimePrivate *)0x0;
    pQStack_50 = (QCborContainerPrivate *)0x0;
    local_38 = QCborValue::toUuid((QCborValue *)value,(QUuid *)&local_58.data);
    seed = qHash(&local_38,seed);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return seed;
  }
LAB_002e98a3:
  __stack_chk_fail();
}

Assistant:

size_t qHash(const QCborValue &value, size_t seed)
{
    switch (value.type()) {
    case QCborValue::Integer:
        return qHash(value.toInteger(), seed);
    case QCborValue::ByteArray:
        return qHash(value.toByteArray(), seed);
    case QCborValue::String:
        return qHash(value.toString(), seed);
    case QCborValue::Array:
        return qHash(value.toArray(), seed);
    case QCborValue::Map:
        return qHash(value.toMap(), seed);
    case QCborValue::Tag: {
        QtPrivate::QHashCombine hash;
        seed = hash(seed, value.tag());
        seed = hash(seed, value.taggedValue());
        return seed;
    }
    case QCborValue::SimpleType:
        break;
    case QCborValue::False:
        return qHash(false, seed);
    case QCborValue::True:
        return qHash(true, seed);
    case QCborValue::Null:
        return qHash(nullptr, seed);
    case QCborValue::Undefined:
        return seed;
    case QCborValue::Double:
        return qHash(value.toDouble(), seed);
#if QT_CONFIG(datestring)
    case QCborValue::DateTime:
        return qHash(value.toDateTime(), seed);
#endif
#ifndef QT_BOOTSTRAPPED
    case QCborValue::Url:
        return qHash(value.toUrl(), seed);
#  if QT_CONFIG(regularexpression)
    case QCborValue::RegularExpression:
        return qHash(value.toRegularExpression(), seed);
#  endif
    case QCborValue::Uuid:
        return qHash(value.toUuid(), seed);
#endif
    case QCborValue::Invalid:
        return seed;
    default:
        break;
    }

    Q_ASSERT(value.isSimpleType());
    return qHash(value.toSimpleType(), seed);
}